

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  cmMakefile *pcVar1;
  size_type sVar2;
  cmGeneratorTarget *pcVar3;
  pointer pbVar4;
  pointer pcVar5;
  size_type sVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  cmValue cVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  string *psVar13;
  LinkClosure *pLVar14;
  byte bVar15;
  cmComputeLinkInformation *pcVar16;
  pointer pbVar17;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar18;
  string install_rpath;
  string d;
  string rootPath;
  string useVar;
  string targetOutputDir;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  undefined1 local_1a0 [32];
  char *local_180;
  undefined8 local_178;
  string *local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_168;
  undefined8 local_160;
  undefined4 local_154;
  cmComputeLinkInformation *local_150;
  undefined4 local_144;
  undefined1 local_140 [32];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_120;
  string local_118;
  string *local_f8;
  string *local_f0;
  string *local_e8;
  string local_e0;
  string *local_a8;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  pcVar1 = this->Makefile;
  local_1a0._0_8_ = local_1a0 + 0x10;
  local_120 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)runtimeDirs;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"CMAKE_SKIP_RPATH","");
  bVar7 = cmMakefile::IsOn(pcVar1,(string *)local_1a0);
  sVar2 = (this->RuntimeFlag)._M_string_length;
  local_150 = this;
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  bVar8 = true;
  if (!for_install) {
    pcVar3 = local_150->Target;
    local_1a0._0_8_ = local_1a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"BUILD_WITH_INSTALL_RPATH","");
    bVar8 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,(string *)local_1a0);
    if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
    }
  }
  pcVar16 = local_150;
  if (bVar7 || sVar2 == 0) {
    local_144 = 0;
    bVar15 = 0;
    local_154 = 0;
  }
  else {
    psVar13 = &local_150->Config;
    bVar7 = cmGeneratorTarget::HaveInstallTreeRPATH(local_150->Target,psVar13);
    bVar9 = cmGeneratorTarget::HaveBuildTreeRPATH(pcVar16->Target,psVar13);
    local_144 = (undefined4)CONCAT71(extraout_var,bVar9 & (bVar8 ^ 1U));
    if ((bVar8 ^ 1U) == 0) {
      pcVar1 = pcVar16->Makefile;
      local_1a0._0_8_ = local_1a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"CMAKE_SKIP_INSTALL_RPATH","");
      bVar9 = cmMakefile::IsOn(pcVar1,(string *)local_1a0);
      if (bVar9) {
        local_154 = 0;
      }
      else {
        pcVar3 = pcVar16->Target;
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"INSTALL_RPATH_USE_LINK_PATH","");
        bVar9 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_e0);
        local_154 = (undefined4)CONCAT71(extraout_var_00,bVar9);
        pcVar16 = local_150;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,
                          (ulong)(local_e0.field_2._M_allocated_capacity + 1));
          pcVar16 = local_150;
        }
      }
      if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
        operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
      }
      bVar15 = bVar8 & bVar7;
    }
    else {
      bVar15 = 0;
      local_154 = 0;
    }
  }
  pcVar1 = pcVar16->Makefile;
  local_1a0._0_8_ = local_1a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,"CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN","");
  local_e8 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_1a0);
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  local_f0 = &pcVar16->Config;
  cmGeneratorTarget::GetDirectory(&local_80,pcVar16->Target,local_f0,RuntimeBinaryArtifact);
  pcVar3 = pcVar16->Target;
  local_1a0._0_8_ = local_1a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"BUILD_RPATH_USE_ORIGIN","");
  bVar7 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,(string *)local_1a0);
  sVar2 = local_e8->_M_string_length;
  if ((string *)local_1a0._0_8_ != (string *)(local_1a0 + 0x10)) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (bVar15 != 0) {
    local_1a0._0_8_ = local_1a0 + 0x10;
    local_1a0._8_8_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    local_1a0._16_8_ = local_1a0._16_8_ & 0xffffffffffffff00;
    cmGeneratorTarget::GetInstallRPATH(pcVar16->Target,local_f0,(string *)local_1a0);
    cmCLI_ExpandListUnique
              ((string *)local_1a0._0_8_,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1a0._8_8_,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_120);
    if ((string *)local_1a0._0_8_ != (string *)(local_1a0 + 0x10)) {
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
    }
  }
  if ((char)local_144 == '\0') {
    if ((char)local_154 == '\0') goto LAB_00557e59;
  }
  else {
    local_1a0._0_8_ = local_1a0 + 0x10;
    local_1a0._8_8_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    local_1a0._16_8_ = local_1a0._16_8_ & 0xffffffffffffff00;
    bVar8 = cmGeneratorTarget::GetBuildRPATH(pcVar16->Target,local_f0,(string *)local_1a0);
    if (bVar8) {
      cmCLI_ExpandListUnique
                ((string *)local_1a0._0_8_,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1a0._8_8_,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_120);
    }
    if ((string *)local_1a0._0_8_ != (string *)(local_1a0 + 0x10)) {
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
    }
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  pcVar1 = pcVar16->Makefile;
  local_1a0._0_8_ = local_1a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"CMAKE_SYSROOT_LINK","");
  cVar11 = cmMakefile::GetDefinition(pcVar1,(string *)local_1a0);
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  if (cVar11.Value == (string *)0x0) {
    pcVar1 = pcVar16->Makefile;
    local_1a0._0_8_ = local_1a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"CMAKE_SYSROOT","");
    cmMakefile::GetSafeDefinition(pcVar1,(string *)local_1a0);
    std::__cxx11::string::_M_assign((string *)&local_118);
    if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_118);
  }
  pcVar1 = pcVar16->Makefile;
  local_1a0._0_8_ = local_1a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"CMAKE_STAGING_PREFIX","");
  cVar11 = cmMakefile::GetDefinition(pcVar1,(string *)local_1a0);
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  pcVar1 = pcVar16->Makefile;
  local_1a0._0_8_ = local_1a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"CMAKE_INSTALL_PREFIX","");
  local_a8 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_1a0);
  if ((string *)local_1a0._0_8_ != (string *)(local_1a0 + 0x10)) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  cmsys::SystemTools::ConvertToUnixSlashes(&local_118);
  pvVar12 = cmOrderDirectories::GetOrderedDirectories_abi_cxx11_
                      ((pcVar16->OrderRuntimeSearchPath)._M_t.
                       super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
                       .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl);
  local_f8 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar16->CMakeInstance);
  pbVar17 = (pvVar12->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (pvVar12->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar17 != pbVar4) {
    do {
      if ((char)local_144 == '\0') {
        if ((char)local_154 != '\0') {
          psVar13 = cmake::GetHomeDirectory_abi_cxx11_(local_150->CMakeInstance);
          bVar8 = cmsys::SystemTools::ComparePath(pbVar17,psVar13);
          if ((((!bVar8) && (bVar8 = cmsys::SystemTools::ComparePath(pbVar17,local_f8), !bVar8)) &&
              (bVar8 = cmsys::SystemTools::IsSubDirectory(pbVar17,psVar13), !bVar8)) &&
             (bVar8 = cmsys::SystemTools::IsSubDirectory(pbVar17,local_f8), !bVar8)) {
            local_140._0_8_ = local_140 + 0x10;
            pcVar5 = (pbVar17->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_140,pcVar5,pcVar5 + pbVar17->_M_string_length);
            if (local_118._M_string_length == 0) {
LAB_00557b89:
              if ((cVar11.Value != (string *)0x0) &&
                 (sVar6 = (cVar11.Value)->_M_string_length, sVar6 != 0)) {
                local_1a0._0_8_ = local_140._8_8_;
                local_1a0._8_8_ = local_140._0_8_;
                __str_02._M_str = ((cVar11.Value)->_M_dataplus)._M_p;
                __str_02._M_len = sVar6;
                iVar10 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                   ((basic_string_view<char,_std::char_traits<char>_> *)local_1a0,0,
                                    sVar6,__str_02);
                if (iVar10 == 0) {
                  std::__cxx11::string::erase((ulong)local_140,0);
                  local_1a0._8_8_ = (local_a8->_M_dataplus)._M_p;
                  local_1a0._0_8_ = local_a8->_M_string_length;
                  local_1a0._16_8_ = 0;
                  local_e0._M_dataplus._M_p = (pointer)0x0;
                  local_e0._M_string_length = 1;
                  local_180 = (char *)((long)&local_e0.field_2 + 8);
                  local_e0.field_2._M_local_buf[8] = '/';
                  local_1a0._24_8_ = 1;
                  local_178 = 0;
                  local_170 = (string *)local_140._8_8_;
                  local_168 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_140._0_8_;
                  local_160 = 0;
                  views_00._M_len = 3;
                  views_00._M_array = (iterator)local_1a0;
                  local_e0.field_2._M_allocated_capacity = (size_type)local_180;
                  cmCatViews(&local_a0,views_00);
                  std::__cxx11::string::operator=((string *)local_140,(string *)&local_a0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                    operator_delete(local_a0._M_dataplus._M_p,
                                    local_a0.field_2._M_allocated_capacity + 1);
                  }
                  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_140);
                }
              }
            }
            else {
              local_1a0._0_8_ = local_140._8_8_;
              local_1a0._8_8_ = local_140._0_8_;
              __str_01._M_str = local_118._M_dataplus._M_p;
              __str_01._M_len = local_118._M_string_length;
              iVar10 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                 ((basic_string_view<char,_std::char_traits<char>_> *)local_1a0,0,
                                  local_118._M_string_length,__str_01);
              if (iVar10 != 0) goto LAB_00557b89;
              std::__cxx11::string::erase((ulong)local_140,0);
            }
            pVar18 = std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::_M_insert_unique<std::__cxx11::string_const&>
                               ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)&local_60,(string *)local_140);
            if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_120,(string *)local_140);
            }
            goto LAB_00557dcb;
          }
        }
      }
      else {
        local_140._0_8_ = local_140 + 0x10;
        pcVar5 = (pbVar17->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_140,pcVar5,pcVar5 + pbVar17->_M_string_length);
        if (local_118._M_string_length == 0) {
LAB_00557956:
          if ((cVar11.Value != (string *)0x0) &&
             (sVar6 = (cVar11.Value)->_M_string_length, sVar6 != 0)) {
            local_1a0._0_8_ = local_140._8_8_;
            local_1a0._8_8_ = local_140._0_8_;
            __str_00._M_str = ((cVar11.Value)->_M_dataplus)._M_p;
            __str_00._M_len = sVar6;
            iVar10 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                               ((basic_string_view<char,_std::char_traits<char>_> *)local_1a0,0,
                                sVar6,__str_00);
            if (iVar10 == 0) {
              std::__cxx11::string::erase((ulong)local_140,0);
              local_1a0._8_8_ = (local_a8->_M_dataplus)._M_p;
              local_1a0._0_8_ = local_a8->_M_string_length;
              local_1a0._16_8_ = 0;
              local_e0._M_dataplus._M_p = (pointer)0x0;
              local_e0._M_string_length = 1;
              local_180 = (char *)((long)&local_e0.field_2 + 8);
              local_e0.field_2._M_local_buf[8] = '/';
              local_1a0._24_8_ = 1;
              local_178 = 0;
              local_170 = (string *)local_140._8_8_;
              local_168 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_140._0_8_;
              local_160 = 0;
              views_01._M_len = 3;
              views_01._M_array = (iterator)local_1a0;
              local_e0.field_2._M_allocated_capacity = (size_type)local_180;
              cmCatViews(&local_a0,views_01);
              std::__cxx11::string::operator=((string *)local_140,(string *)&local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              cmsys::SystemTools::ConvertToUnixSlashes((string *)local_140);
              goto LAB_00557da6;
            }
          }
          if (((bVar7 && local_80._M_string_length != 0) && sVar2 != 0) &&
             ((bVar8 = cmsys::SystemTools::ComparePath((string *)local_140,local_f8), bVar8 ||
              (bVar8 = cmsys::SystemTools::IsSubDirectory((string *)local_140,local_f8), bVar8)))) {
            cmSystemTools::RelativePath((string *)local_1a0,&local_80,(string *)local_140);
            std::__cxx11::string::operator=((string *)local_140,(string *)local_1a0);
            if ((string *)local_1a0._0_8_ != (string *)(local_1a0 + 0x10)) {
              operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
            }
            if ((string *)local_140._8_8_ == (string *)0x0) {
              std::__cxx11::string::_M_assign((string *)local_140);
            }
            else {
              local_1a0._8_8_ = (local_e8->_M_dataplus)._M_p;
              local_1a0._0_8_ = local_e8->_M_string_length;
              local_1a0._16_8_ = 0;
              local_1a0._24_8_ = 1;
              local_180 = "/";
              local_178 = 0;
              local_170 = (string *)local_140._8_8_;
              local_168 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_140._0_8_;
              local_160 = 0;
              views._M_len = 3;
              views._M_array = (iterator)local_1a0;
              cmCatViews(&local_e0,views);
              std::__cxx11::string::operator=((string *)local_140,(string *)&local_e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,
                                (ulong)(local_e0.field_2._M_allocated_capacity + 1));
              }
            }
          }
        }
        else {
          local_1a0._0_8_ = local_140._8_8_;
          local_1a0._8_8_ = local_140._0_8_;
          __str._M_str = local_118._M_dataplus._M_p;
          __str._M_len = local_118._M_string_length;
          iVar10 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_1a0,0,
                              local_118._M_string_length,__str);
          if (iVar10 != 0) goto LAB_00557956;
          std::__cxx11::string::erase((ulong)local_140,0);
        }
LAB_00557da6:
        pVar18 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&local_60,(string *)local_140);
        if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_120,(string *)local_140);
        }
LAB_00557dcb:
        if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_140._0_8_ !=
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_140 + 0x10)) {
          operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
        }
      }
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 != pbVar4);
  }
  pcVar16 = local_150;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
    pcVar16 = local_150;
  }
LAB_00557e59:
  pLVar14 = cmGeneratorTarget::GetLinkClosure(pcVar16->Target,local_f0);
  pbVar17 = (pLVar14->Languages).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (pLVar14->Languages).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar17 != pbVar4) {
    do {
      local_1a0._0_8_ = (string *)0x6;
      local_1a0._8_8_ = "CMAKE_";
      local_1a0._16_8_ = 0;
      local_180 = (pbVar17->_M_dataplus)._M_p;
      local_1a0._24_8_ = pbVar17->_M_string_length;
      local_178 = 0;
      local_170 = (string *)0x2e;
      local_168 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x94fc65;
      local_160 = 0;
      views_02._M_len = 3;
      views_02._M_array = (iterator)local_1a0;
      cmCatViews(&local_e0,views_02);
      bVar7 = cmMakefile::IsOn(local_150->Makefile,&local_e0);
      if (bVar7) {
        local_1a0._0_8_ = (string *)0x6;
        local_1a0._8_8_ = "CMAKE_";
        local_1a0._16_8_ = 0;
        local_180 = (pbVar17->_M_dataplus)._M_p;
        local_1a0._24_8_ = pbVar17->_M_string_length;
        local_178 = 0;
        local_170 = (string *)0x1a;
        local_168 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x94fbb6;
        local_160 = 0;
        views_03._M_len = 3;
        views_03._M_array = (iterator)local_1a0;
        cmCatViews(&local_118,views_03);
        cVar11 = cmMakefile::GetDefinition(local_150->Makefile,&local_118);
        if (cVar11.Value != (string *)0x0) {
          cmCLI_ExpandListUnique
                    ((string *)((cVar11.Value)->_M_dataplus)._M_p,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(cVar11.Value)->_M_string_length,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_120);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,
                          CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                   local_118.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,
                        (ulong)(local_e0.field_2._M_allocated_capacity + 1));
      }
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 != pbVar4);
  }
  cmCLI_ExpandListUnique
            ((string *)(local_150->RuntimeAlways)._M_dataplus._M_p,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_150->RuntimeAlways)._M_string_length,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_120);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install) const
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH(this->Config) &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath = outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Select whether to use $ORIGIN in RPATHs for artifacts in the build tree.
  std::string const& originToken = this->Makefile->GetSafeDefinition(
    "CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN");
  std::string targetOutputDir = this->Target->GetDirectory(this->Config);
  bool use_relative_build_rpath =
    this->Target->GetPropertyAsBool("BUILD_RPATH_USE_ORIGIN") &&
    !originToken.empty() && !targetOutputDir.empty();

  // Construct the RPATH.
  std::set<std::string> emitted;
  if (use_install_rpath) {
    std::string install_rpath;
    this->Target->GetInstallRPATH(this->Config, install_rpath);
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
  }
  if (use_build_rpath) {
    // Add directories explicitly specified by user
    std::string build_rpath;
    if (this->Target->GetBuildRPATH(this->Config, build_rpath)) {
      // This will not resolve entries to use $ORIGIN, the user is expected
      // to do that if necessary.
      cmCLI_ExpandListUnique(build_rpath, runtimeDirs, emitted);
    }
  }
  if (use_build_rpath || use_link_rpath) {
    std::string rootPath;
    if (cmValue sysrootLink =
          this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
      rootPath = *sysrootLink;
    } else {
      rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    }
    cmValue stagePath = this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    std::string const& installPrefix =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    std::string const& topBinaryDir =
      this->CMakeInstance->GetHomeOutputDirectory();
    for (std::string const& ri : rdirs) {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if (use_build_rpath) {
        std::string d = ri;
        if (!rootPath.empty() && cmHasPrefix(d, rootPath)) {
          d.erase(0, rootPath.size());
        } else if (cmNonempty(stagePath) && cmHasPrefix(d, *stagePath)) {
          d.erase(0, (*stagePath).size());
          d = cmStrCat(installPrefix, '/', d);
          cmSystemTools::ConvertToUnixSlashes(d);
        } else if (use_relative_build_rpath) {
          // If expansion of the $ORIGIN token is supported and permitted per
          // policy, use relative paths in the RPATH.
          if (cmSystemTools::ComparePath(d, topBinaryDir) ||
              cmSystemTools::IsSubDirectory(d, topBinaryDir)) {
            d = cmSystemTools::RelativePath(targetOutputDir, d);
            if (!d.empty()) {
              d = cmStrCat(originToken, "/", d);
            } else {
              d = originToken;
            }
          }
        }
        if (emitted.insert(d).second) {
          runtimeDirs.push_back(std::move(d));
        }
      } else if (use_link_rpath) {
        // Do not add any path inside the source or build tree.
        std::string const& topSourceDir =
          this->CMakeInstance->GetHomeDirectory();
        if (!cmSystemTools::ComparePath(ri, topSourceDir) &&
            !cmSystemTools::ComparePath(ri, topBinaryDir) &&
            !cmSystemTools::IsSubDirectory(ri, topSourceDir) &&
            !cmSystemTools::IsSubDirectory(ri, topBinaryDir)) {
          std::string d = ri;
          if (!rootPath.empty() && cmHasPrefix(d, rootPath)) {
            d.erase(0, rootPath.size());
          } else if (cmNonempty(stagePath) && cmHasPrefix(d, *stagePath)) {
            d.erase(0, (*stagePath).size());
            d = cmStrCat(installPrefix, '/', d);
            cmSystemTools::ConvertToUnixSlashes(d);
          }
          if (emitted.insert(d).second) {
            runtimeDirs.push_back(std::move(d));
          }
        }
      }
    }
  }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
    cmGeneratorTarget::LinkClosure const* lc =
      this->Target->GetLinkClosure(this->Config);
    for (std::string const& li : lc->Languages) {
      std::string useVar = cmStrCat(
        "CMAKE_", li, "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH");
      if (this->Makefile->IsOn(useVar)) {
        std::string dirVar =
          cmStrCat("CMAKE_", li, "_IMPLICIT_LINK_DIRECTORIES");
        if (cmValue dirs = this->Makefile->GetDefinition(dirVar)) {
          cmCLI_ExpandListUnique(*dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways, runtimeDirs, emitted);
}